

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompt.c
# Opt level: O3

wchar_t prompt_set(EditLine *el,el_pfunc_t prf,wchar_t c,wchar_t op,wchar_t wide)

{
  code *pcVar1;
  el_prompt_t *peVar2;
  
  peVar2 = &el->el_rprompt;
  if (op == L'\0' || op == L'\x15') {
    peVar2 = &el->el_prompt;
  }
  pcVar1 = prompt_default_r;
  if (op == L'\0' || op == L'\x15') {
    pcVar1 = prompt_default;
  }
  if (prf != (el_pfunc_t)0x0) {
    pcVar1 = prf;
  }
  peVar2->p_func = pcVar1;
  peVar2->p_ignore = c;
  (peVar2->p_pos).h = L'\0';
  (peVar2->p_pos).v = L'\0';
  peVar2->p_wide = wide;
  return L'\0';
}

Assistant:

libedit_private int
prompt_set(EditLine *el, el_pfunc_t prf, wchar_t c, int op, int wide)
{
	el_prompt_t *p;

	if (op == EL_PROMPT || op == EL_PROMPT_ESC)
		p = &el->el_prompt;
	else
		p = &el->el_rprompt;

	if (prf == NULL) {
		if (op == EL_PROMPT || op == EL_PROMPT_ESC)
			p->p_func = prompt_default;
		else
			p->p_func = prompt_default_r;
	} else {
		p->p_func = prf;
	}

	p->p_ignore = c;

	p->p_pos.v = 0;
	p->p_pos.h = 0;
	p->p_wide = wide;

	return 0;
}